

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O1

void av1_filter_block_plane_horz_opt_chroma
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,int plane,
               _Bool joint_filter_chroma,int num_mis_in_lpf_unit_height_log2)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  loop_filter_info_n *lfi_n;
  BLOCK_SIZE BVar3;
  uint uVar4;
  uint uVar5;
  aom_bit_depth_t bd;
  MB_MODE_INFO **ppMVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *pMVar8;
  loop_filter_thresh *_blimit0;
  bool bVar9;
  uint16_t *s;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  long lVar18;
  USE_FILTER_TYPE use_filter_type;
  int iVar19;
  int iVar20;
  uchar *s_00;
  uint uVar21;
  uint16_t *s_01;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar26;
  ulong uVar27;
  uint8_t *dst_ptr;
  byte *pbVar28;
  uint8_t *puVar29;
  int iVar30;
  AV1_DEBLOCKING_PARAMETERS *pAVar31;
  ulong uVar25;
  
  uVar4 = plane_ptr->subsampling_x;
  uVar5 = plane_ptr->subsampling_y;
  bVar15 = (byte)uVar4;
  bVar16 = (byte)uVar5;
  iVar19 = (((1 << (bVar16 & 0x1f)) >> 1) + (((plane_ptr->dst).height << (bVar16 & 0x1f)) + 3 >> 2)
           >> (bVar16 & 0x1f)) - (mi_row >> (bVar16 & 0x1f));
  iVar30 = (1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f)) >> (bVar16 & 0x1f);
  if (iVar19 < iVar30) {
    iVar30 = iVar19;
  }
  uVar26 = (((1 << (bVar15 & 0x1f)) >> 1) + (((plane_ptr->dst).width << (bVar15 & 0x1f)) + 3 >> 2)
           >> (bVar15 & 0x1f)) - (mi_col >> (bVar15 & 0x1f));
  uVar21 = 0x20 >> (bVar15 & 0x1f);
  if ((int)uVar26 < (int)uVar21) {
    uVar21 = uVar26;
  }
  if (0 < (int)uVar21) {
    iVar19 = (plane_ptr->dst).stride;
    lVar18 = (long)((cm->mi_params).mi_stride << (bVar16 & 0x1f));
    uVar22 = (iVar30 << (bVar16 & 0x1f)) + mi_row;
    uVar23 = uVar5 | mi_row;
    lfi_n = &cm->lf_info;
    uVar26 = 0;
    do {
      params_buf->filter_length = '\0';
      uVar24 = (uVar26 << (bVar15 & 0x1f)) + mi_col | uVar4;
      uVar25 = (ulong)uVar24;
      uVar12 = (cm->mi_params).mi_stride * uVar23;
      ppMVar6 = (cm->mi_params).mi_grid_base;
      pMVar7 = ppMVar6[uVar12 + uVar25];
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar7->field_0xa7 & 7] == 0)) {
        if (plane == 0) {
          bVar17 = pMVar7->tx_size;
        }
        else {
          bVar11 = ""[av1_ss_size_lookup[pMVar7->bsize][(int)uVar4][(int)uVar5]];
          if (bVar11 < 0x11) {
            bVar17 = 3;
            if ((1 < bVar11 - 0xb) && (bVar11 != 4)) {
LAB_0038da62:
              bVar17 = bVar11;
            }
          }
          else if (bVar11 == 0x11) {
            bVar17 = 9;
          }
          else {
            if (bVar11 != 0x12) goto LAB_0038da62;
            bVar17 = 10;
          }
        }
        if ((plane == 0) &&
           ((((pMVar7->field_0xa7 & 0x80) != 0 || ('\0' < pMVar7->ref_frame[0])) &&
            (pMVar7->skip_txfm == '\0')))) {
          BVar3 = pMVar7->bsize;
          bVar17 = pMVar7->inter_tx_size
                   [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar3] - 1 & uVar24) >>
                    (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                    (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [BVar3] - 1 & uVar23) >>
                     (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                    (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
        }
      }
      else {
        bVar17 = 0;
      }
      *tx_buf = bVar17;
      if (mi_row == 0) {
        iVar20 = 0x40;
      }
      else {
        pMVar8 = ppMVar6[(ulong)uVar12 + (uVar25 - lVar18)];
        if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar8->field_0xa7 & 7] == 0)) {
          if (plane == 0) {
            bVar11 = pMVar8->tx_size;
          }
          else {
            bVar10 = ""[av1_ss_size_lookup[pMVar8->bsize][(int)uVar4][(int)uVar5]];
            if (bVar10 < 0x11) {
              bVar11 = 3;
              if ((1 < bVar10 - 0xb) && (bVar10 != 4)) {
LAB_0038db9c:
                bVar11 = bVar10;
              }
            }
            else if (bVar10 == 0x11) {
              bVar11 = 9;
            }
            else {
              if (bVar10 != 0x12) goto LAB_0038db9c;
              bVar11 = 10;
            }
          }
          if ((plane == 0) &&
             ((((pMVar8->field_0xa7 & 0x80) != 0 || ('\0' < pMVar8->ref_frame[0])) &&
              (pMVar8->skip_txfm == '\0')))) {
            BVar3 = pMVar8->bsize;
            bVar11 = pMVar8->inter_tx_size
                     [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [BVar3] - 1 & uVar24) >>
                      (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                      (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [BVar3] - 1 & (-1 << (bVar16 & 0x1f)) + uVar23) >>
                       (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                      (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
          }
        }
        else {
          bVar11 = 0;
        }
        iVar20 = tx_size_wide[bVar11];
        bVar10 = get_filter_level(cm,lfi_n,1,plane,pMVar7);
        if (bVar10 == 0) {
          bVar10 = get_filter_level(cm,lfi_n,1,plane,pMVar8);
        }
        bVar9 = true;
        if ((pMVar8 == pMVar7) && (pMVar7->skip_txfm != '\0')) {
          if ((pMVar7->field_0xa7 & 0x80) == 0) {
            bVar9 = pMVar7->ref_frame[0] < '\x01';
          }
          else {
            bVar9 = false;
          }
        }
        if ((bool)(bVar10 != 0 & (pMVar8 != pMVar7 | bVar9))) {
          params_buf->filter_length = (uint8_t)horz_filter_length_chroma[bVar17][bVar11];
          params_buf->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar10 * 0x30);
        }
      }
      iVar14 = tx_size_wide[bVar17];
      if (iVar20 < tx_size_wide[bVar17]) {
        iVar14 = iVar20;
      }
      uVar27 = (ulong)*tx_buf;
      iVar20 = tx_size_high_unit[uVar27];
      uVar12 = (iVar20 << (bVar16 & 0x1f)) + mi_row;
      if (uVar12 < uVar22) {
        pbVar28 = tx_buf + iVar20;
        pAVar31 = params_buf + iVar20;
        do {
          pAVar31->filter_length = '\0';
          uVar13 = (cm->mi_params).mi_stride * (uVar5 | uVar12);
          ppMVar6 = (cm->mi_params).mi_grid_base;
          pMVar7 = ppMVar6[uVar13 + uVar25];
          if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar7->field_0xa7 & 7] == 0))
          {
            if (plane == 0) {
              bVar17 = pMVar7->tx_size;
            }
            else {
              bVar11 = ""[av1_ss_size_lookup[pMVar7->bsize][(int)uVar4][(int)uVar5]];
              if (bVar11 < 0x11) {
                bVar17 = 3;
                if ((1 < bVar11 - 0xb) && (bVar11 != 4)) {
LAB_0038ddcc:
                  bVar17 = bVar11;
                }
              }
              else if (bVar11 == 0x11) {
                bVar17 = 9;
              }
              else {
                if (bVar11 != 0x12) goto LAB_0038ddcc;
                bVar17 = 10;
              }
            }
            if ((plane == 0) &&
               ((((pMVar7->field_0xa7 & 0x80) != 0 || ('\0' < pMVar7->ref_frame[0])) &&
                (pMVar7->skip_txfm == '\0')))) {
              BVar3 = pMVar7->bsize;
              bVar17 = pMVar7->inter_tx_size
                       [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [BVar3] - 1 & uVar24) >>
                        (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                        (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [BVar3] - 1 & (uVar5 | uVar12)) >>
                         (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                        (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
            }
          }
          else {
            bVar17 = 0;
          }
          *pbVar28 = bVar17;
          pMVar8 = ppMVar6[(ulong)uVar13 + (uVar25 - lVar18)];
          bVar11 = get_filter_level(cm,lfi_n,1,plane,pMVar7);
          if (bVar11 == 0) {
            bVar11 = get_filter_level(cm,lfi_n,1,plane,pMVar8);
          }
          bVar9 = true;
          if ((pMVar8 == pMVar7) && (pMVar7->skip_txfm != '\0')) {
            if ((pMVar7->field_0xa7 & 0x80) == 0) {
              bVar9 = pMVar7->ref_frame[0] < '\x01';
            }
            else {
              bVar9 = false;
            }
          }
          if ((bool)(bVar11 != 0 & (pMVar8 != pMVar7 | bVar9))) {
            pAVar31->filter_length = (uint8_t)horz_filter_length_chroma[bVar17][uVar27];
            pAVar31->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar11 * 0x30);
          }
          if (tx_size_wide[bVar17] <= iVar14) {
            iVar14 = tx_size_wide[bVar17];
          }
          uVar27 = (ulong)*pbVar28;
          iVar20 = tx_size_high_unit[uVar27];
          uVar12 = uVar12 + (iVar20 << (bVar16 & 0x1f));
          pbVar28 = pbVar28 + iVar20;
          pAVar31 = pAVar31 + iVar20;
        } while (uVar12 < uVar22);
      }
      if ((((uVar26 & 3) == 0) && ((int)(uVar26 | 3) < (int)uVar21)) && (0xf < iVar14)) {
        uVar24 = 2;
        uVar12 = 3;
      }
      else {
        uVar24 = 0;
        uVar12 = 0;
        if ((uVar26 & 1) == 0) {
          uVar24 = (uint)(7 < iVar14 && (int)(uVar26 | 1) < (int)uVar21);
          uVar12 = uVar24;
        }
      }
      if (0 < iVar30) {
        iVar20 = 0;
        pbVar28 = tx_buf;
        pAVar31 = params_buf;
        do {
          if (*pbVar28 == 0xff) {
            pAVar31->filter_length = '\0';
            *pbVar28 = 0;
          }
          iVar14 = iVar19 * 4 * iVar20 + uVar26 * 4;
          puVar29 = (plane_ptr->dst).buf + iVar14;
          use_filter_type = (USE_FILTER_TYPE)uVar24;
          if (joint_filter_chroma) {
            _blimit0 = pAVar31->lfthr;
            s_00 = plane_ptr[1].dst.buf + iVar14;
            if (cm->seq_params->use_highbitdepth == '\0') {
              uVar13 = pAVar31->filter_length - 4;
              uVar13 = uVar13 >> 1 | (uint)((uVar13 & 1) != 0) << 0x1f;
              if (use_filter_type == '\x01') {
                if (uVar13 == 1) {
                  puVar1 = _blimit0->lim;
                  puVar2 = _blimit0->hev_thr;
                  aom_lpf_horizontal_6_dual_sse2
                            (puVar29,iVar19,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                  aom_lpf_horizontal_6_dual_sse2
                            (s_00,iVar19,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2
                            );
                }
                else if (uVar13 == 0) {
                  puVar1 = _blimit0->lim;
                  puVar2 = _blimit0->hev_thr;
                  aom_lpf_horizontal_4_dual_sse2
                            (puVar29,iVar19,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                  aom_lpf_horizontal_4_dual_sse2
                            (s_00,iVar19,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2
                            );
                }
              }
              else if (uVar24 == 2) {
                if (uVar13 == 1) {
                  (*aom_lpf_horizontal_6_quad)
                            (puVar29,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                  (*aom_lpf_horizontal_6_quad)
                            (s_00,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                }
                else if (uVar13 == 0) {
                  aom_lpf_horizontal_4_quad_sse2
                            (puVar29,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                  aom_lpf_horizontal_4_quad_sse2
                            (s_00,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                }
              }
              else if (uVar13 == 1) {
                aom_lpf_horizontal_6_sse2
                          (puVar29,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                aom_lpf_horizontal_6_sse2
                          (s_00,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              }
              else if (uVar13 == 0) {
                aom_lpf_horizontal_4_sse2
                          (puVar29,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                aom_lpf_horizontal_4_sse2
                          (s_00,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              }
            }
            else {
              bd = cm->seq_params->bit_depth;
              s = (uint16_t *)((long)puVar29 * 2);
              s_01 = (uint16_t *)((long)s_00 * 2);
              uVar13 = pAVar31->filter_length - 4;
              uVar13 = uVar13 >> 1 | (uint)((uVar13 & 1) != 0) << 0x1f;
              if (use_filter_type == '\x01') {
                if (uVar13 == 1) {
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
LAB_0038e4a9:
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s_01,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                }
                else if (uVar13 == 0) {
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
LAB_0038e266:
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s_01,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                }
              }
              else if (uVar24 == 2) {
                if (uVar13 == 1) {
                  puVar29 = _blimit0->lim;
                  puVar1 = _blimit0->hev_thr;
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s,iVar19,_blimit0->mblim,puVar29,puVar1,_blimit0->mblim,puVar29,puVar1,
                             bd);
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s + 8,iVar19,_blimit0->mblim,puVar29,puVar1,_blimit0->mblim,puVar29,
                             puVar1,bd);
                  aom_highbd_lpf_horizontal_6_dual_sse2
                            (s_01,iVar19,_blimit0->mblim,puVar29,puVar1,_blimit0->mblim,puVar29,
                             puVar1,bd);
                  s_01 = s_01 + 8;
                  goto LAB_0038e4a9;
                }
                if (uVar13 == 0) {
                  puVar29 = _blimit0->lim;
                  puVar1 = _blimit0->hev_thr;
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s,iVar19,_blimit0->mblim,puVar29,puVar1,_blimit0->mblim,puVar29,puVar1,
                             bd);
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s + 8,iVar19,_blimit0->mblim,puVar29,puVar1,_blimit0->mblim,puVar29,
                             puVar1,bd);
                  (*aom_highbd_lpf_horizontal_4_dual)
                            (s_01,iVar19,_blimit0->mblim,puVar29,puVar1,_blimit0->mblim,puVar29,
                             puVar1,bd);
                  s_01 = s_01 + 8;
                  goto LAB_0038e266;
                }
              }
              else if (uVar13 == 1) {
                aom_highbd_lpf_horizontal_6_sse2
                          (s,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                aom_highbd_lpf_horizontal_6_sse2
                          (s_01,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
              }
              else if (uVar13 == 0) {
                aom_highbd_lpf_horizontal_4_sse2
                          (s,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                aom_highbd_lpf_horizontal_4_sse2
                          (s_01,iVar19,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
              }
            }
          }
          else {
            filter_horz(puVar29,iVar19,pAVar31,cm->seq_params,use_filter_type);
          }
          iVar14 = tx_size_high_unit[*pbVar28];
          iVar20 = iVar20 + iVar14;
          pbVar28 = pbVar28 + iVar14;
          pAVar31 = pAVar31 + iVar14;
        } while (iVar20 < iVar30);
      }
      uVar26 = uVar26 + uVar12 + 1;
    } while ((int)uVar26 < (int)uVar21);
  }
  return;
}

Assistant:

void av1_filter_block_plane_horz_opt_chroma(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int plane, bool joint_filter_chroma,
    int num_mis_in_lpf_unit_height_log2) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int mi_cols =
      ((plane_ptr->dst.width << scale_horz) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int mi_rows =
      ((plane_ptr->dst.height << scale_vert) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int plane_mi_rows = ROUND_POWER_OF_TWO(mi_rows, scale_vert);
  const int plane_mi_cols = ROUND_POWER_OF_TWO(mi_cols, scale_horz);
  const int y_range =
      AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
             ((1 << num_mis_in_lpf_unit_height_log2) >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  const ptrdiff_t mode_step = cm->mi_params.mi_stride << scale_vert;
  for (int x = 0; x < x_range; x++) {
    const uint32_t y_start = mi_row + (0 << scale_vert);
    const uint32_t curr_x = mi_col + (x << scale_horz);
    const uint32_t y_end = mi_row + (y_range << scale_vert);
    int min_width = tx_size_wide[TX_64X64];
    set_lpf_parameters_for_line_chroma(params_buf, tx_buf, cm, xd, HORZ_EDGE,
                                       curr_x, y_start, plane_ptr, y_end,
                                       mode_step, scale_horz, scale_vert,
                                       &min_width, plane, joint_filter_chroma);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE use_filter_type = USE_SINGLE;
    int x_inc = 0;

    if ((x & 3) == 0 && (x + 3) < x_range && min_width >= 16) {
      // If we are on a col which is a multiple of 4, and the minimum width is
      // 16 pixels, then the current and right 3 cols must contain the same tx
      // block. This is because dim 16 can only happen every unit of 4 mi's.
      use_filter_type = USE_QUAD;
      x_inc = 3;
    } else if (x % 2 == 0 && (x + 1) < x_range && min_width >= 8) {
      // If we are on an even col, and the minimum width is 8 pixels, then the
      // current and left cols must contain the same tx block. This is because
      // dim 4 can only happen every unit of 2**0, and 8 every unit of 2**1,
      // etc.
      use_filter_type = USE_DUAL;
      x_inc = 1;
    }

    for (int y = 0; y < y_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will first filter the vertical edge aligned with a 8x8
      // block. If 4x4 transform is used, it will then filter the internal
      // edge aligned with a 4x4 block
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      const int offset = y * MI_SIZE * dst_stride + x * MI_SIZE;
      if (joint_filter_chroma) {
        uint8_t *u_dst = plane_ptr[0].dst.buf + offset;
        uint8_t *v_dst = plane_ptr[1].dst.buf + offset;
        filter_horz_chroma(u_dst, v_dst, dst_stride, params, cm->seq_params,
                           use_filter_type);
      } else {
        uint8_t *dst_ptr = plane_ptr->dst.buf + offset;
        filter_horz(dst_ptr, dst_stride, params, cm->seq_params,
                    use_filter_type);
      }

      // advance the destination pointer
      const int advance_units = tx_size_high_unit[*tx_size];
      y += advance_units;
      params += advance_units;
      tx_size += advance_units;
    }
    x += x_inc;
  }
}